

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayout::separatorRect(QDockAreaLayout *this,int index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  QRect QVar10;
  
  bVar5 = QDockAreaLayoutInfo::isEmpty(this->docks + index);
  uVar7 = 0;
  uVar6 = 0xffffffffffffffff;
  uVar8 = 0xffffffff;
  if (bVar5) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    if ((uint)index < 4) {
      uVar1 = this->docks[index].rect.x1.m_i;
      uVar2 = this->docks[index].rect.y1.m_i;
      uVar7 = (ulong)uVar2;
      uVar3 = this->docks[index].rect.x2.m_i;
      uVar8 = (ulong)uVar3;
      uVar4 = this->docks[index].rect.y2.m_i;
      uVar6 = (ulong)uVar4;
      uVar9 = uVar1;
      switch(index) {
      case 0:
        uVar9 = uVar3 + 1;
        uVar8 = (ulong)(uVar3 + this->sep);
        break;
      case 1:
        uVar9 = uVar1 - this->sep;
        uVar8 = (ulong)(uVar1 - 1);
        break;
      case 2:
        uVar7 = (ulong)(uVar4 + 1);
        uVar6 = (ulong)(uVar4 + this->sep);
        break;
      case 3:
        uVar6 = (ulong)(uVar2 - 1);
        uVar7 = (ulong)(uVar2 - this->sep);
      }
    }
  }
  QVar10._0_8_ = (ulong)uVar9 | uVar7 << 0x20;
  QVar10._8_8_ = uVar8 | uVar6 << 0x20;
  return QVar10;
}

Assistant:

QRect QDockAreaLayout::separatorRect(int index) const
{
    const QDockAreaLayoutInfo &dock = docks[index];
    if (dock.isEmpty())
        return QRect();
    QRect r = dock.rect;
    switch (index) {
        case QInternal::LeftDock:
            return QRect(r.right() + 1, r.top(), sep, r.height());
        case QInternal::RightDock:
            return QRect(r.left() - sep, r.top(), sep, r.height());
        case QInternal::TopDock:
            return QRect(r.left(), r.bottom() + 1, r.width(), sep);
        case QInternal::BottomDock:
            return QRect(r.left(), r.top() - sep, r.width(), sep);
        default:
            break;
    }
    return QRect();
}